

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int cf_string_cmp_raw(cf_string_t *self,char *s,cf_size_t s_len)

{
  bool bVar1;
  ulong local_38;
  cf_size_t len;
  char *ptr;
  cf_size_t s_len_local;
  char *s_local;
  cf_string_t *self_local;
  
  len = (cf_size_t)self->ptr;
  local_38 = (ulong)(*(uint *)self >> 1);
  ptr = (char *)s_len;
  s_len_local = (cf_size_t)s;
  while( true ) {
    bVar1 = false;
    if ((*(char *)len == *(char *)s_len_local) && (bVar1 = false, local_38 != 0)) {
      bVar1 = ptr != (char *)0x0;
    }
    if (!bVar1) break;
    len = len + 1;
    s_len_local = s_len_local + 1;
    local_38 = local_38 - 1;
    ptr = ptr + -1;
  }
  if ((local_38 == 0) && (ptr == (char *)0x0)) {
    self_local._4_4_ = 0;
  }
  else if ((local_38 == 0) || (ptr != (char *)0x0)) {
    if ((ptr == (char *)0x0) || (local_38 != 0)) {
      self_local._4_4_ = 1;
      if (*(byte *)len < *(byte *)s_len_local) {
        self_local._4_4_ = -1;
      }
    }
    else {
      self_local._4_4_ = -1;
    }
  }
  else {
    self_local._4_4_ = 1;
  }
  return self_local._4_4_;
}

Assistant:

int cf_string_cmp_raw(const cf_string_t* self, const char* s, cf_size_t s_len) {
    const char* ptr = self->ptr;
    cf_size_t len = self->len;
    for (; *ptr == *s && len > 0 && s_len > 0; ++ptr, ++s, --len, --s_len);
    if (len == 0 && s_len == 0) return 0;
    if (len > 0 && s_len == 0) return 1;
    if (s_len > 0 && len == 0) return -1;
    return (*CF_TYPE_CAST(cf_uchar_t*, ptr) < *CF_TYPE_CAST(cf_uchar_t*, s) ? -1 : 1);
}